

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeEnum::TypeEnum(TypeEnum *this,SynIdentifier *identifier,SynBase *source,ScopeData *scope)

{
  uint uVar1;
  ScopeData *scope_local;
  SynBase *source_local;
  SynIdentifier *identifier_local;
  TypeEnum *this_local;
  
  TypeStruct::TypeStruct(&this->super_TypeStruct,0x19,identifier->name);
  (this->super_TypeStruct).super_TypeBase._vptr_TypeBase = (_func_int **)&PTR__TypeEnum_00308680;
  SynIdentifier::SynIdentifier(&this->identifier,identifier);
  this->source = source;
  this->scope = scope;
  (this->super_TypeStruct).super_TypeBase.size = 4;
  uVar1 = GetTypeAlignment<int>();
  (this->super_TypeStruct).super_TypeBase.alignment = uVar1;
  return;
}

Assistant:

TypeEnum(const SynIdentifier& identifier, SynBase *source, ScopeData *scope): TypeStruct(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope)
	{
		size = 4;
		alignment = GetTypeAlignment<int>();
	}